

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O3

string * __thiscall
Function::getXInputName_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_88;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->eType != INPUT_X) goto LAB_00131db0;
  pcVar2 = (this->sName)._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (this->sName)._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  Unit::getName_abi_cxx11_(&local_48,&(this->super_Physical).physicalUnit);
  uVar4 = 0xf;
  if (local_68 != local_58) {
    uVar4 = local_58[0];
  }
  if (uVar4 < local_48._M_string_length + local_60) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      uVar5 = local_48.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_48._M_string_length + local_60) goto LAB_00131ceb;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_68);
  }
  else {
LAB_00131ceb:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_88.field_2._M_allocated_capacity = *psVar1;
    local_88.field_2._8_8_ = puVar3[3];
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar1;
    local_88._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_88._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    return __return_storage_ptr__;
  }
LAB_00131db0:
  if (this->xLeft != (Function *)0x0) {
    getXInputName_abi_cxx11_(&local_88,this->xLeft);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if (this->xRight != (Function *)0x0) {
    getXInputName_abi_cxx11_(&local_88,this->xRight);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if (this->xPlus != (Function *)0x0) {
    getXInputName_abi_cxx11_(&local_88,this->xPlus);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Function::getXInputName()
{
	string name;
	if (eType == INPUT_X)
		name = sName + ", " + physicalUnit.getName();
	if (!name.length() && xLeft)
		name = xLeft->getXInputName();
	if (!name.length() && xRight)
		name = xRight->getXInputName();
	if (!name.length() && xPlus)
		name = xPlus->getXInputName();
	return name;
}